

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * testing::TempDir_abi_cxx11_(void)

{
  string *in_RDI;
  char *in_R8;
  char in_R9B;
  initializer_list<const_char_*> environment_variables;
  char *local_18;
  char *local_10;
  
  local_18 = "TEST_TMPDIR";
  local_10 = "TMPDIR";
  environment_variables._M_len = (size_type)"/tmp/";
  environment_variables._M_array = (iterator)0x2;
  GetDirFromEnv_abi_cxx11_(in_RDI,(testing *)&local_18,environment_variables,in_R8,in_R9B);
  return in_RDI;
}

Assistant:

std::string TempDir() {
#if defined(GTEST_CUSTOM_TEMPDIR_FUNCTION_)
  return GTEST_CUSTOM_TEMPDIR_FUNCTION_();
#elif defined(GTEST_OS_WINDOWS) || defined(GTEST_OS_WINDOWS_MOBILE)
  return GetDirFromEnv({"TEST_TMPDIR", "TEMP"}, "\\temp\\", '\\');
#elif defined(GTEST_OS_LINUX_ANDROID)
  return GetDirFromEnv({"TEST_TMPDIR", "TMPDIR"}, "/data/local/tmp/", '/');
#else
  return GetDirFromEnv({"TEST_TMPDIR", "TMPDIR"}, "/tmp/", '/');
#endif
}